

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_reader_init_filename(mpack_reader_t *reader,char *filename)

{
  FILE *file;
  
  file = fopen(filename,"rb");
  if (file != (FILE *)0x0) {
    mpack_reader_init_stdfile(reader,(FILE *)file,true);
    return;
  }
  reader->end = (char *)0x0;
  *(undefined8 *)&reader->error = 0;
  reader->size = 0;
  reader->data = (char *)0x0;
  reader->skip = (mpack_reader_skip_t)0x0;
  reader->buffer = (char *)0x0;
  reader->error_fn = (mpack_reader_error_t)0x0;
  reader->teardown = (mpack_reader_teardown_t)0x0;
  reader->context = (void *)0x0;
  reader->fill = (mpack_reader_fill_t)0x0;
  reader->error = mpack_error_io;
  return;
}

Assistant:

void mpack_reader_init_filename(mpack_reader_t* reader, const char* filename) {
    mpack_assert(filename != NULL, "filename is NULL");

    FILE* file = fopen(filename, "rb");
    if (file == NULL) {
        mpack_reader_init_error(reader, mpack_error_io);
        return;
    }

    mpack_reader_init_stdfile(reader, file, true);
}